

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O1

void show_help(void)

{
  printf("Usage:  xlsxio_csv2xlsx [-h] [-s separator] [-d rows] [-n] csvfile ...\nParameters:\n  -h          \tdisplay command line help\n  -s separator\tspecify separator to use (default is comma)\n  -d rows     \trows used for column width detection (default is %i)\n  -t          \ttread top row as header row\n  csvfile     \tpath to CSV file (multiple may be specified)\nDescription:\nConverts all specified CSV (Comma Separated Values) files to .xlsx files.\nVersion: 0.2.36\n\n"
         ,0x14);
  return;
}

Assistant:

void show_help ()
{
  printf(
    "Usage:  xlsxio_csv2xlsx [-h] [-s separator] [-d rows] [-n] csvfile ...\n"
    "Parameters:\n"
    "  -h          \tdisplay command line help\n"
    "  -s separator\tspecify separator to use (default is comma)\n"
    "  -d rows     \trows used for column width detection (default is %i)\n"
    "  -t          \ttread top row as header row\n"
    "  csvfile     \tpath to CSV file (multiple may be specified)\n"
    "Description:\n"
    "Converts all specified CSV (Comma Separated Values) files to .xlsx files.\n"
    "Version: " XLSXIO_VERSION_STRING "\n"
    "\n", DEFAULT_DETECTION_ROWS
  );
}